

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall
smf::MidiMessage::makeTimeSignature
          (MidiMessage *this,int top,int bottom,int clocksPerClick,int num32ndsPerQuarter)

{
  value_type vVar1;
  reference pvVar2;
  int base2;
  int num32ndsPerQuarter_local;
  int clocksPerClick_local;
  int bottom_local;
  int top_local;
  MidiMessage *this_local;
  
  vVar1 = '\0';
  num32ndsPerQuarter_local = bottom;
  while (num32ndsPerQuarter_local = num32ndsPerQuarter_local >> 1, num32ndsPerQuarter_local != 0) {
    vVar1 = vVar1 + '\x01';
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,7);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  *pvVar2 = 0xff;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,1);
  *pvVar2 = 'X';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,2);
  *pvVar2 = '\x04';
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,3);
  *pvVar2 = (value_type)top;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,4);
  *pvVar2 = vVar1;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,5);
  *pvVar2 = (value_type)clocksPerClick;
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                     (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,6);
  *pvVar2 = (value_type)num32ndsPerQuarter;
  return;
}

Assistant:

void MidiMessage::makeTimeSignature(int top, int bottom, int clocksPerClick,
		int num32ndsPerQuarter) {
	int base2 = 0;
	while (bottom >>= 1) base2++;
	resize(7);
	(*this)[0] = 0xff;
	(*this)[1] = 0x58;
	(*this)[2] = 4;
	(*this)[3] = 0xff & top;
	(*this)[4] = 0xff & base2;
	(*this)[5] = 0xff & clocksPerClick;
	(*this)[6] = 0xff & num32ndsPerQuarter;
}